

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

Literals * __thiscall
anon_unknown.dwarf_65694::CtorEvalExternalInterface::callImport
          (Literals *__return_storage_ptr__,CtorEvalExternalInterface *this,Function *import,
          Literals *arguments)

{
  char **ppcVar1;
  initializer_list<wasm::Literal> init;
  initializer_list<wasm::Literal> init_00;
  initializer_list<wasm::Literal> init_01;
  initializer_list<wasm::Literal> init_02;
  bool bVar2;
  int32_t iVar3;
  reference pvVar4;
  pointer pMVar5;
  size_t sVar6;
  Literal *pLVar7;
  FailToEvalException *pFVar8;
  bool local_561;
  Literal *local_528;
  bool local_509;
  Literal *local_4c8;
  bool local_499;
  Literal *local_458;
  bool local_439;
  Literal *local_3f8;
  bool local_3c9;
  string local_3a0;
  string local_380;
  allocator<char> local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  IString local_2b8;
  undefined1 local_2a8 [8];
  string extra;
  Literal local_280;
  iterator local_268;
  undefined8 local_260;
  undefined1 local_252;
  undefined1 local_251;
  string local_250;
  BasicType local_22c;
  Type local_228;
  BasicType local_21c;
  IString local_218;
  element_type *local_208;
  element_type local_200;
  Address local_1c0;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  string local_1b0;
  BasicType local_18c;
  Type local_188;
  BasicType local_17c;
  IString local_178;
  Literal *local_168;
  Literal local_160;
  iterator local_148;
  undefined8 local_140;
  undefined1 local_132;
  undefined1 local_131;
  string local_130;
  BasicType local_10c;
  Type local_108;
  BasicType local_fc;
  IString local_f8;
  element_type *local_e8;
  element_type local_e0;
  Address local_a0;
  undefined1 local_95;
  allocator<char> local_81;
  string local_80;
  BasicType local_5c;
  Type local_58;
  BasicType local_4c;
  IString local_48;
  undefined1 local_38 [8];
  Name WASI;
  Literals *arguments_local;
  Function *import_local;
  CtorEvalExternalInterface *this_local;
  
  WASI.super_IString.str._M_str = (char *)arguments;
  ::wasm::Name::Name((Name *)local_38,"wasi_snapshot_preview1");
  if ((((anonymous_namespace)::ignoreExternalInput & 1) != 0) &&
     (bVar2 = ::wasm::IString::operator==
                        (&(import->super_Importable).module.super_IString,(IString *)local_38),
     bVar2)) {
    ::wasm::IString::IString(&local_48,"environ_sizes_get");
    bVar2 = ::wasm::IString::operator==(&(import->super_Importable).base.super_IString,&local_48);
    if (bVar2) {
      sVar6 = ::wasm::SmallVector<wasm::Literal,_1UL>::size
                        ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str);
      local_3c9 = true;
      if (sVar6 == 2) {
        pLVar7 = ::wasm::SmallVector<wasm::Literal,_1UL>::operator[]
                           ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str,0);
        local_4c = i32;
        bVar2 = ::wasm::Type::operator!=(&pLVar7->type,&local_4c);
        local_3c9 = true;
        if (!bVar2) {
          local_58 = ::wasm::Function::getResults(import);
          local_5c = i32;
          local_3c9 = ::wasm::Type::operator!=(&local_58,&local_5c);
        }
      }
      if (local_3c9 != false) {
        local_95 = 1;
        pFVar8 = (FailToEvalException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"wasi environ_sizes_get has wrong sig",&local_81);
        FailToEvalException::FailToEvalException(pFVar8,&local_80);
        local_95 = 0;
        __cxa_throw(pFVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                    FailToEvalException::~FailToEvalException);
      }
      pLVar7 = ::wasm::SmallVector<wasm::Literal,_1UL>::operator[]
                         ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str,0);
      iVar3 = ::wasm::Literal::geti32(pLVar7);
      ::wasm::Address::Address(&local_a0,(long)iVar3);
      pvVar4 = std::
               vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ::operator[](&this->wasm->memories,0);
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar4)
      ;
      local_e0.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           (undefined4)(pMVar5->super_Importable).super_Named.name.super_IString.str._M_len;
      local_e0.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ =
           *(undefined4 *)
            ((long)&(pMVar5->super_Importable).super_Named.name.super_IString.str._M_len + 4);
      ppcVar1 = &(pMVar5->super_Importable).super_Named.name.super_IString.str._M_str;
      local_e0.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)ppcVar1;
      local_e0.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           *(undefined4 *)
            ((long)&(pMVar5->super_Importable).super_Named.name.super_IString.str._M_str + 4);
      (*(this->super_ExternalInterface)._vptr_ExternalInterface[0x18])
                (this,local_a0.addr,0,
                 (pMVar5->super_Importable).super_Named.name.super_IString.str._M_len,*ppcVar1);
      local_e8 = &local_e0;
      ::wasm::Literal::Literal((Literal *)local_e8,0);
      local_e0.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
      super_IString.str._M_str = (char *)&local_e0;
      local_e0.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 1;
      init_02._M_len = 1;
      init_02._M_array =
           (iterator)
           local_e0.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
           super_IString.str._M_str;
      ::wasm::Literals::Literals(__return_storage_ptr__,init_02);
      local_3f8 = (Literal *)
                  ((long)&local_e0.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                          field_0 + 8);
      do {
        local_3f8 = local_3f8 + -1;
        ::wasm::Literal::~Literal(local_3f8);
      } while ((element_type *)local_3f8 != &local_e0);
    }
    else {
      ::wasm::IString::IString(&local_f8,"environ_get");
      bVar2 = ::wasm::IString::operator==(&(import->super_Importable).base.super_IString,&local_f8);
      if (bVar2) {
        sVar6 = ::wasm::SmallVector<wasm::Literal,_1UL>::size
                          ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str);
        local_439 = true;
        if (sVar6 == 2) {
          pLVar7 = ::wasm::SmallVector<wasm::Literal,_1UL>::operator[]
                             ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str,0);
          local_fc = i32;
          bVar2 = ::wasm::Type::operator!=(&pLVar7->type,&local_fc);
          local_439 = true;
          if (!bVar2) {
            local_108 = ::wasm::Function::getResults(import);
            local_10c = i32;
            local_439 = ::wasm::Type::operator!=(&local_108,&local_10c);
          }
        }
        if (local_439 != false) {
          local_132 = 1;
          pFVar8 = (FailToEvalException *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"wasi environ_get has wrong sig",
                     (allocator<char> *)&local_131);
          FailToEvalException::FailToEvalException(pFVar8,&local_130);
          local_132 = 0;
          __cxa_throw(pFVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                      FailToEvalException::~FailToEvalException);
        }
        local_168 = &local_160;
        ::wasm::Literal::Literal(local_168,0);
        local_148 = &local_160;
        local_140 = 1;
        init_01._M_len = 1;
        init_01._M_array = local_148;
        ::wasm::Literals::Literals(__return_storage_ptr__,init_01);
        local_458 = (Literal *)&local_148;
        do {
          local_458 = local_458 + -1;
          ::wasm::Literal::~Literal(local_458);
        } while (local_458 != &local_160);
      }
      else {
        ::wasm::IString::IString(&local_178,"args_sizes_get");
        bVar2 = ::wasm::IString::operator==
                          (&(import->super_Importable).base.super_IString,&local_178);
        if (bVar2) {
          sVar6 = ::wasm::SmallVector<wasm::Literal,_1UL>::size
                            ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str);
          local_499 = true;
          if (sVar6 == 2) {
            pLVar7 = ::wasm::SmallVector<wasm::Literal,_1UL>::operator[]
                               ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str,0);
            local_17c = i32;
            bVar2 = ::wasm::Type::operator!=(&pLVar7->type,&local_17c);
            local_499 = true;
            if (!bVar2) {
              local_188 = ::wasm::Function::getResults(import);
              local_18c = i32;
              local_499 = ::wasm::Type::operator!=(&local_188,&local_18c);
            }
          }
          if (local_499 != false) {
            local_1b2 = 1;
            pFVar8 = (FailToEvalException *)__cxa_allocate_exception(0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b0,"wasi args_sizes_get has wrong sig",&local_1b1);
            FailToEvalException::FailToEvalException(pFVar8,&local_1b0);
            local_1b2 = 0;
            __cxa_throw(pFVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                        FailToEvalException::~FailToEvalException);
          }
          pLVar7 = ::wasm::SmallVector<wasm::Literal,_1UL>::operator[]
                             ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str,0);
          iVar3 = ::wasm::Literal::geti32(pLVar7);
          ::wasm::Address::Address(&local_1c0,(long)iVar3);
          pvVar4 = std::
                   vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ::operator[](&this->wasm->memories,0);
          pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                             (pvVar4);
          local_200.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (undefined4)(pMVar5->super_Importable).super_Named.name.super_IString.str._M_len;
          local_200.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ =
               *(undefined4 *)
                ((long)&(pMVar5->super_Importable).super_Named.name.super_IString.str._M_len + 4);
          ppcVar1 = &(pMVar5->super_Importable).super_Named.name.super_IString.str._M_str;
          local_200.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)ppcVar1;
          local_200.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               *(undefined4 *)
                ((long)&(pMVar5->super_Importable).super_Named.name.super_IString.str._M_str + 4);
          (*(this->super_ExternalInterface)._vptr_ExternalInterface[0x18])
                    (this,local_1c0.addr,0,
                     (pMVar5->super_Importable).super_Named.name.super_IString.str._M_len,*ppcVar1);
          local_208 = &local_200;
          ::wasm::Literal::Literal((Literal *)local_208,0);
          local_200.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
          super_IString.str._M_str = (char *)&local_200;
          local_200.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 1;
          init_00._M_len = 1;
          init_00._M_array =
               (iterator)
               local_200.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func
               .super_IString.str._M_str;
          ::wasm::Literals::Literals(__return_storage_ptr__,init_00);
          local_4c8 = (Literal *)
                      ((long)&local_200.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
                              [0].field_0 + 8);
          do {
            local_4c8 = local_4c8 + -1;
            ::wasm::Literal::~Literal(local_4c8);
          } while ((element_type *)local_4c8 != &local_200);
        }
        else {
          ::wasm::IString::IString(&local_218,"args_get");
          bVar2 = ::wasm::IString::operator==
                            (&(import->super_Importable).base.super_IString,&local_218);
          if (!bVar2) goto LAB_00199a7f;
          sVar6 = ::wasm::SmallVector<wasm::Literal,_1UL>::size
                            ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str);
          local_509 = true;
          if (sVar6 == 2) {
            pLVar7 = ::wasm::SmallVector<wasm::Literal,_1UL>::operator[]
                               ((SmallVector<wasm::Literal,_1UL> *)WASI.super_IString.str._M_str,0);
            local_21c = i32;
            bVar2 = ::wasm::Type::operator!=(&pLVar7->type,&local_21c);
            local_509 = true;
            if (!bVar2) {
              local_228 = ::wasm::Function::getResults(import);
              local_22c = i32;
              local_509 = ::wasm::Type::operator!=(&local_228,&local_22c);
            }
          }
          if (local_509 != false) {
            local_252 = 1;
            pFVar8 = (FailToEvalException *)__cxa_allocate_exception(0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,"wasi args_get has wrong sig",
                       (allocator<char> *)&local_251);
            FailToEvalException::FailToEvalException(pFVar8,&local_250);
            local_252 = 0;
            __cxa_throw(pFVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
                        FailToEvalException::~FailToEvalException);
          }
          extra.field_2._8_8_ = &local_280;
          ::wasm::Literal::Literal((Literal *)extra.field_2._8_8_,0);
          local_268 = &local_280;
          local_260 = 1;
          init._M_len = 1;
          init._M_array = local_268;
          ::wasm::Literals::Literals(__return_storage_ptr__,init);
          local_528 = (Literal *)&local_268;
          do {
            local_528 = local_528 + -1;
            ::wasm::Literal::~Literal(local_528);
          } while (local_528 != &local_280);
        }
      }
    }
    return __return_storage_ptr__;
  }
LAB_00199a7f:
  std::__cxx11::string::string((string *)local_2a8);
  bVar2 = ::wasm::IString::operator==
                    (&(import->super_Importable).module.super_IString,(IString *)&::wasm::ENV);
  local_561 = false;
  if (bVar2) {
    ::wasm::IString::IString(&local_2b8,"___cxa_atexit");
    local_561 = ::wasm::IString::operator==
                          (&(import->super_Importable).base.super_IString,&local_2b8);
  }
  if (local_561 == false) {
    bVar2 = ::wasm::IString::operator==
                      (&(import->super_Importable).module.super_IString,(IString *)local_38);
    if ((bVar2) && (((anonymous_namespace)::ignoreExternalInput & 1) == 0)) {
      std::__cxx11::string::operator=
                ((string *)local_2a8,"\n       recommendation: consider --ignore-external-input");
    }
  }
  else {
    std::__cxx11::string::operator=
              ((string *)local_2a8,
               "\n       recommendation: build with -s NO_EXIT_RUNTIME=1 so that calls to atexit are not emitted"
              );
  }
  pFVar8 = (FailToEvalException *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"call import: ",&local_359);
  ::wasm::IString::toString_abi_cxx11_(&local_380,&(import->super_Importable).module.super_IString);
  std::operator+(&local_338,&local_358,&local_380);
  std::operator+(&local_318,&local_338,".");
  ::wasm::IString::toString_abi_cxx11_(&local_3a0,&(import->super_Importable).base.super_IString);
  std::operator+(&local_2f8,&local_318,&local_3a0);
  std::operator+(&local_2d8,&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
  FailToEvalException::FailToEvalException(pFVar8,&local_2d8);
  __cxa_throw(pFVar8,&(anonymous_namespace)::FailToEvalException::typeinfo,
              FailToEvalException::~FailToEvalException);
}

Assistant:

Literals callImport(Function* import, const Literals& arguments) override {
    Name WASI("wasi_snapshot_preview1");

    if (ignoreExternalInput) {
      if (import->module == WASI) {
        if (import->base == "environ_sizes_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi environ_sizes_get has wrong sig");
          }

          // Write out a count of i32(0) and return __WASI_ERRNO_SUCCESS (0).
          store32(arguments[0].geti32(), 0, wasm->memories[0]->name);
          return {Literal(int32_t(0))};
        }

        if (import->base == "environ_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi environ_get has wrong sig");
          }

          // Just return __WASI_ERRNO_SUCCESS (0).
          return {Literal(int32_t(0))};
        }

        if (import->base == "args_sizes_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi args_sizes_get has wrong sig");
          }

          // Write out an argc of i32(0) and return a __WASI_ERRNO_SUCCESS (0).
          store32(arguments[0].geti32(), 0, wasm->memories[0]->name);
          return {Literal(int32_t(0))};
        }

        if (import->base == "args_get") {
          if (arguments.size() != 2 || arguments[0].type != Type::i32 ||
              import->getResults() != Type::i32) {
            throw FailToEvalException("wasi args_get has wrong sig");
          }

          // Just return __WASI_ERRNO_SUCCESS (0).
          return {Literal(int32_t(0))};
        }

        // Otherwise, we don't recognize this import; continue normally to
        // error.
      }
    }

    std::string extra;
    if (import->module == ENV && import->base == "___cxa_atexit") {
      extra = RECOMMENDATION "build with -s NO_EXIT_RUNTIME=1 so that calls "
                             "to atexit are not emitted";
    } else if (import->module == WASI && !ignoreExternalInput) {
      extra = RECOMMENDATION "consider --ignore-external-input";
    }
    throw FailToEvalException(std::string("call import: ") +
                              import->module.toString() + "." +
                              import->base.toString() + extra);
  }